

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool check_fileext(path *filepath,string *fileext)

{
  long *plVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  string ext;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string_type local_70;
  path local_50;
  
  auVar6 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar6._8_8_ == -1 || auVar6._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,auVar6._0_8_);
    std::filesystem::__cxx11::path::path(&local_50,&local_70,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,local_50._M_pathname._M_dataplus._M_p,
             local_50._M_pathname._M_dataplus._M_p + local_50._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(&local_50);
  sVar2 = local_88;
  plVar1 = local_90;
  if (local_88 != 0) {
    sVar4 = 0;
    do {
      iVar3 = tolower((int)*(char *)((long)plVar1 + sVar4));
      *(char *)((long)plVar1 + sVar4) = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  if (local_88 == fileext->_M_string_length) {
    if (local_88 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_90,(fileext->_M_dataplus)._M_p,local_88);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return bVar5;
}

Assistant:

bool check_fileext(const filesystem::path &filepath, const std::string fileext) {
	std::string ext{filepath.extension().string()}; // extract file ext
	std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);                 // make ext lowercase
	return ext == fileext;
}